

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParsePITarget(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  byte *str;
  xmlChar *pxVar2;
  xmlChar *in_R8;
  long lVar3;
  
  str = xmlParseName(ctxt);
  if (str != (byte *)0x0) {
    if ((((*str | 0x20) == 0x78) && ((str[1] | 0x20) == 0x6d)) && ((str[2] | 0x20) == 0x6c)) {
      if (str[2] == 0x6c && (str[1] == 0x6d && *str == 0x78)) {
        if (str[3] == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_RESERVED_XML_NAME,
                         "XML declaration allowed only at the start of the document\n");
          return str;
        }
      }
      else if (str[3] == 0) {
        xmlFatalErr(ctxt,XML_ERR_RESERVED_XML_NAME,(char *)0x0);
        return str;
      }
      lVar3 = 0;
      do {
        if (lVar3 == 0x10) {
          xmlWarningMsg(ctxt,XML_ERR_RESERVED_XML_NAME,
                        "xmlParsePITarget: invalid name prefix \'xml\'\n",(xmlChar *)0x0,in_R8);
          goto LAB_00159564;
        }
        iVar1 = xmlStrEqual(str,*(xmlChar **)((long)xmlW3CPIs + lVar3));
        lVar3 = lVar3 + 8;
      } while (iVar1 == 0);
    }
    else {
LAB_00159564:
      pxVar2 = xmlStrchr(str,':');
      if (pxVar2 != (xmlChar *)0x0) {
        xmlNsErr(ctxt,XML_NS_ERR_COLON,"colons are forbidden from PI names \'%s\'\n",str,
                 (xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
  }
  return str;
}

Assistant:

const xmlChar *
xmlParsePITarget(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;

    name = xmlParseName(ctxt);
    if ((name != NULL) &&
        ((name[0] == 'x') || (name[0] == 'X')) &&
        ((name[1] == 'm') || (name[1] == 'M')) &&
        ((name[2] == 'l') || (name[2] == 'L'))) {
	int i;
	if ((name[0] == 'x') && (name[1] == 'm') &&
	    (name[2] == 'l') && (name[3] == 0)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_RESERVED_XML_NAME,
		 "XML declaration allowed only at the start of the document\n");
	    return(name);
	} else if (name[3] == 0) {
	    xmlFatalErr(ctxt, XML_ERR_RESERVED_XML_NAME, NULL);
	    return(name);
	}
	for (i = 0;;i++) {
	    if (xmlW3CPIs[i] == NULL) break;
	    if (xmlStrEqual(name, (const xmlChar *)xmlW3CPIs[i]))
	        return(name);
	}
	xmlWarningMsg(ctxt, XML_ERR_RESERVED_XML_NAME,
		      "xmlParsePITarget: invalid name prefix 'xml'\n",
		      NULL, NULL);
    }
    if ((name != NULL) && (xmlStrchr(name, ':') != NULL)) {
	xmlNsErr(ctxt, XML_NS_ERR_COLON,
		 "colons are forbidden from PI names '%s'\n", name, NULL, NULL);
    }
    return(name);
}